

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O3

void __thiscall EDCircles::GenerateCandidateCircles(EDCircles *this)

{
  int iVar1;
  int iVar2;
  Circle *pCVar3;
  double *pdVar4;
  bool bVar5;
  long lVar6;
  EllipseEquation *pEq;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  EllipseEquation eq;
  EllipseEquation local_68;
  
  if (0 < this->edarcs4->noArcs) {
    pEq = &this->edarcs4->arcs->eq;
    lVar6 = 0;
    do {
      dVar8 = pEq[-1].coeff[0];
      if (*(bool *)((long)(pEq + -1) + 0x34) == true) {
        if ((dVar8 < 0.5) || (1.5 < pEq[1].coeff[0])) {
          dVar10 = *(double *)((long)(pEq + -2) + 0x28);
          uVar7 = -(ulong)(dVar10 < *(double *)((long)(pEq + -2) + 0x30));
          dVar10 = ((double)(~uVar7 & (ulong)(6.283185307179586 - dVar10) | (ulong)-dVar10 & uVar7)
                   + *(double *)((long)(pEq + -2) + 0x30)) / 6.283185307179586;
          if (dVar8 <= dVar10) {
            dVar8 = dVar10;
          }
          if ((((0.67 <= dVar8) && (dVar10 = *(double *)((long)(pEq + -2) + 0x20), dVar10 <= 1.5))
              || ((0.5 <= dVar8 && (dVar10 = *(double *)((long)(pEq + -2) + 0x20), dVar10 <= 1.25)))
              ) || ((0.33 <= dVar8 && (dVar10 = *(double *)((long)(pEq + -2) + 0x20), dVar10 <= 1.0)
                    ))) {
LAB_0010e623:
            pCVar3 = this->circles1;
            dVar8 = *(double *)((long)(pEq + -2) + 0x18);
            iVar1 = *(int *)((long)(pEq + -1) + 0x30);
            iVar2 = this->noCircles1;
            dVar9 = *(double *)((long)(pEq + -2) + 0x10);
            pCVar3[iVar2].xc = *(double *)((long)(pEq + -2) + 8);
            pCVar3[iVar2].yc = dVar9;
            pCVar3[iVar2].r = dVar8;
            pCVar3[iVar2].circleFitError = dVar10;
            pCVar3[iVar2].coverRatio = (double)iVar1 / (dVar8 * 6.283185307179586);
            pdVar4 = *(double **)((long)(pEq + -1) + 0x28);
            pCVar3[iVar2].x = *(double **)((long)(pEq + -1) + 0x20);
            (&pCVar3[iVar2].x)[1] = pdVar4;
            pCVar3[iVar2].noPixels = iVar1;
            iVar1 = this->noCircles1;
            pCVar3[iVar1].isEllipse = false;
            this->noCircles1 = iVar1 + 1;
          }
        }
        else {
          addCircle(this->circles1,&this->noCircles1,*(double *)((long)(pEq + -2) + 8),
                    *(double *)((long)(pEq + -2) + 0x10),*(double *)((long)(pEq + -2) + 0x18),
                    *(double *)((long)(pEq + -2) + 0x20),pEq,pEq[1].coeff[0],
                    *(double **)((long)(pEq + -1) + 0x20),*(double **)((long)(pEq + -1) + 0x28),
                    *(int *)((long)(pEq + -1) + 0x30));
        }
      }
      else if (0.25 <= dVar8) {
        if ((((0.67 <= dVar8) && (dVar10 = *(double *)((long)(pEq + -2) + 0x20), dVar10 <= 1.5)) ||
            ((0.5 <= dVar8 && (dVar10 = *(double *)((long)(pEq + -2) + 0x20), dVar10 <= 1.25)))) ||
           ((0.33 <= dVar8 && (dVar10 = *(double *)((long)(pEq + -2) + 0x20), dVar10 <= 1.0))))
        goto LAB_0010e623;
        if (0.33 <= dVar8) {
          local_68.coeff[4] = 0.0;
          local_68.coeff[5] = 0.0;
          local_68.coeff[2] = 0.0;
          local_68.coeff[3] = 0.0;
          local_68.coeff[0] = 0.0;
          local_68.coeff[1] = 0.0;
          local_68.coeff[6] = 0.0;
          iVar1 = *(int *)((long)(pEq + -1) + 0x30);
          bVar5 = EllipseFit(*(double **)((long)(pEq + -1) + 0x20),
                             *(double **)((long)(pEq + -1) + 0x28),iVar1,&local_68,1);
          if (bVar5) {
            dVar8 = ComputeEllipseError(&local_68,*(double **)((long)(pEq + -1) + 0x20),
                                        *(double **)((long)(pEq + -1) + 0x28),iVar1);
            dVar10 = computeEllipsePerimeter(&local_68);
            if (dVar8 <= 1.5) {
              dVar9 = pEq[-1].coeff[0];
              if (pEq[-1].coeff[0] <= (double)iVar1 / dVar10) {
                dVar9 = (double)iVar1 / dVar10;
              }
              if (0.5 <= dVar9) {
                addCircle(this->circles1,&this->noCircles1,*(double *)((long)(pEq + -2) + 8),
                          *(double *)((long)(pEq + -2) + 0x10),*(double *)((long)(pEq + -2) + 0x18),
                          *(double *)((long)(pEq + -2) + 0x20),&local_68,dVar8,
                          *(double **)((long)(pEq + -1) + 0x20),
                          *(double **)((long)(pEq + -1) + 0x28),*(int *)((long)(pEq + -1) + 0x30));
              }
            }
          }
        }
      }
      lVar6 = lVar6 + 1;
      pEq = pEq + 3;
    } while (lVar6 < this->edarcs4->noArcs);
  }
  return;
}

Assistant:

void EDCircles::GenerateCandidateCircles()
{
	// Now, go over the circular arcs & add them to circles1
	MyArc *arcs = edarcs4->arcs;
	for (int i = 0; i<edarcs4->noArcs; i++) {
		if (arcs[i].isEllipse) {
			// Ellipse
			if (arcs[i].coverRatio >= CANDIDATE_ELLIPSE_RATIO && arcs[i].ellipseFitError <= ELLIPSE_ERROR) {
				addCircle(circles1, noCircles1, arcs[i].xc, arcs[i].yc, arcs[i].r, arcs[i].circleFitError, &arcs[i].eq, arcs[i].ellipseFitError,
					arcs[i].x, arcs[i].y, arcs[i].noPixels);

			}
			else {
				//        double coverRatio = arcs[i].coverRatio;
				double coverRatio = MAX(ArcLength(arcs[i].sTheta, arcs[i].eTheta) / TWOPI, arcs[i].coverRatio);
				if ((coverRatio >= FULL_CIRCLE_RATIO && arcs[i].circleFitError <= LONG_ARC_ERROR) ||
					(coverRatio >= HALF_CIRCLE_RATIO && arcs[i].circleFitError <= HALF_ARC_ERROR) ||
					(coverRatio >= CANDIDATE_CIRCLE_RATIO2 && arcs[i].circleFitError <= SHORT_ARC_ERROR)) {
					addCircle(circles1, noCircles1, arcs[i].xc, arcs[i].yc, arcs[i].r, arcs[i].circleFitError, arcs[i].x, arcs[i].y, arcs[i].noPixels);
				} //end-if
			} //end-else

		}
		else {
			// If a very short arc, ignore
			if (arcs[i].coverRatio < CANDIDATE_CIRCLE_RATIO1) continue;

			// If the arc is long enough and the circleFitError is small enough, assume a circle
			if ((arcs[i].coverRatio >= FULL_CIRCLE_RATIO && arcs[i].circleFitError <= LONG_ARC_ERROR) ||
				(arcs[i].coverRatio >= HALF_CIRCLE_RATIO && arcs[i].circleFitError <= HALF_ARC_ERROR) ||
				(arcs[i].coverRatio >= CANDIDATE_CIRCLE_RATIO2 && arcs[i].circleFitError <= SHORT_ARC_ERROR)){

				addCircle(circles1, noCircles1, arcs[i].xc, arcs[i].yc, arcs[i].r, arcs[i].circleFitError, arcs[i].x, arcs[i].y, arcs[i].noPixels);

				continue;
			} //end-if

			if (arcs[i].coverRatio < CANDIDATE_CIRCLE_RATIO2) continue;

			// Circle is not possible. Try an ellipse
			EllipseEquation eq;
			double ellipseFitError = 1e10;
			double coverRatio;

			int noPixels = arcs[i].noPixels;
			if (EllipseFit(arcs[i].x, arcs[i].y, noPixels, &eq)) {
				ellipseFitError = ComputeEllipseError(&eq, arcs[i].x, arcs[i].y, noPixels);
				coverRatio = noPixels / computeEllipsePerimeter(&eq);
			} //end-if

			if (arcs[i].coverRatio > coverRatio) coverRatio = arcs[i].coverRatio;

			if (coverRatio >= CANDIDATE_ELLIPSE_RATIO && ellipseFitError <= ELLIPSE_ERROR) {
				addCircle(circles1, noCircles1, arcs[i].xc, arcs[i].yc, arcs[i].r, arcs[i].circleFitError, &eq, ellipseFitError, arcs[i].x, arcs[i].y, arcs[i].noPixels);
			} //end-if
			} //end-else
		} //end-for
}